

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_file(Ptr *image,string *filename)

{
  shared_ptr<const_core::Image<float>_> local_28;
  string *local_18;
  string *filename_local;
  Ptr *image_local;
  
  local_18 = filename;
  filename_local = (string *)image;
  std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
            ((shared_ptr<core::Image<float>const> *)&local_28,image);
  save_file((ConstPtr *)&local_28,local_18);
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
save_file (FloatImage::Ptr image, std::string const& filename)
{
    save_file(FloatImage::ConstPtr(image), filename);
}